

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void nlohmann::json_abi_v3_11_3::detail::dtoa_impl::grisu2
               (char *buf,int *len,int *decimal_exponent,diyfp m_minus,diyfp v,diyfp m_plus)

{
  diyfp w_00;
  diyfp M_plus_00;
  int iVar1;
  int *in_RDX;
  cached_power cVar2;
  diyfp dVar3;
  diyfp M_plus;
  diyfp M_minus;
  diyfp w_plus;
  diyfp w_minus;
  diyfp w;
  diyfp c_minus_k;
  cached_power cached;
  undefined8 in_stack_fffffffffffffed8;
  diyfp *in_stack_ffffffffffffff38;
  diyfp *in_stack_ffffffffffffff40;
  diyfp local_b8;
  uint64_t local_a8;
  int local_a0;
  uint64_t local_98;
  int local_90;
  uint64_t local_88;
  int local_80;
  uint64_t local_78;
  int e_;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa4;
  int *piVar4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffb4;
  uint64_t in_stack_ffffffffffffffc0;
  uint64_t f_;
  int e__00;
  int iVar6;
  int *length;
  
  cVar2 = get_cached_power_for_binary_exponent((int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  f_ = cVar2.f;
  e__00 = cVar2.e;
  iVar6 = cVar2.k;
  diyfp::diyfp((diyfp *)&stack0xffffffffffffffb8,f_,e__00);
  dVar3 = diyfp::mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  length = (int *)dVar3.f;
  iVar1 = dVar3.e;
  piVar4 = length;
  iVar5 = iVar1;
  dVar3 = diyfp::mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_88 = dVar3.f;
  local_80 = dVar3.e;
  local_78 = local_88;
  e_ = local_80;
  dVar3 = diyfp::mul(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_a8 = dVar3.f;
  local_a0 = dVar3.e;
  local_98 = local_a8;
  local_90 = local_a0;
  diyfp::diyfp(&local_b8,local_78 + 1,e_);
  diyfp::diyfp((diyfp *)&stack0xffffffffffffff38,local_98 - 1,local_90);
  *in_RDX = -iVar6;
  dVar3.e = iVar5;
  dVar3.f = (uint64_t)piVar4;
  dVar3._12_4_ = in_stack_ffffffffffffffb4;
  w_00._8_8_ = f_;
  w_00.f = in_stack_ffffffffffffffc0;
  M_plus_00.f._4_4_ = iVar6;
  M_plus_00.f._0_4_ = e__00;
  M_plus_00._8_8_ = in_RDX;
  grisu2_digit_gen((char *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),length,
                   (int *)CONCAT44(in_stack_ffffffffffffff94,e_),dVar3,w_00,M_plus_00);
  return;
}

Assistant:

inline void grisu2(char* buf, int& len, int& decimal_exponent,
                   diyfp m_minus, diyfp v, diyfp m_plus)
{
    JSON_ASSERT(m_plus.e == m_minus.e);
    JSON_ASSERT(m_plus.e == v.e);

    //  --------(-----------------------+-----------------------)--------    (A)
    //          m-                      v                       m+
    //
    //  --------------------(-----------+-----------------------)--------    (B)
    //                      m-          v                       m+
    //
    // First scale v (and m- and m+) such that the exponent is in the range
    // [alpha, gamma].

    const cached_power cached = get_cached_power_for_binary_exponent(m_plus.e);

    const diyfp c_minus_k(cached.f, cached.e); // = c ~= 10^-k

    // The exponent of the products is = v.e + c_minus_k.e + q and is in the range [alpha,gamma]
    const diyfp w       = diyfp::mul(v,       c_minus_k);
    const diyfp w_minus = diyfp::mul(m_minus, c_minus_k);
    const diyfp w_plus  = diyfp::mul(m_plus,  c_minus_k);

    //  ----(---+---)---------------(---+---)---------------(---+---)----
    //          w-                      w                       w+
    //          = c*m-                  = c*v                   = c*m+
    //
    // diyfp::mul rounds its result and c_minus_k is approximated too. w, w- and
    // w+ are now off by a small amount.
    // In fact:
    //
    //      w - v * 10^k < 1 ulp
    //
    // To account for this inaccuracy, add resp. subtract 1 ulp.
    //
    //  --------+---[---------------(---+---)---------------]---+--------
    //          w-  M-                  w                   M+  w+
    //
    // Now any number in [M-, M+] (bounds included) will round to w when input,
    // regardless of how the input rounding algorithm breaks ties.
    //
    // And digit_gen generates the shortest possible such number in [M-, M+].
    // Note that this does not mean that Grisu2 always generates the shortest
    // possible number in the interval (m-, m+).
    const diyfp M_minus(w_minus.f + 1, w_minus.e);
    const diyfp M_plus (w_plus.f  - 1, w_plus.e );

    decimal_exponent = -cached.k; // = -(-k) = k

    grisu2_digit_gen(buf, len, decimal_exponent, M_minus, w, M_plus);
}